

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O1

void __thiscall DatabaseConfig::set(DatabaseConfig *this,ConfigKey *key,uint64_t value)

{
  value_t t;
  json_value jVar1;
  reference pvVar2;
  runtime_error *this_00;
  json_value local_18;
  
  if ((key->min_ <= value) && (value <= key->max_)) {
    local_18 = (json_value)value;
    pvVar2 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](&this->config_,&key->key_);
    t = pvVar2->m_type;
    pvVar2->m_type = number_unsigned;
    jVar1 = pvVar2->m_value;
    (pvVar2->m_value).number_unsigned = (number_unsigned_t)local_18;
    local_18 = jVar1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&local_18.boolean,t);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Tried to set config to invalid value");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool DatabaseConfig::can_set(const ConfigKey &key, uint64_t value) const {
    if (value < key.min()) {
        return false;
    }
    if (value > key.max()) {
        return false;
    }
    return true;
}